

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

void printS5ImmOperand(MCInst *MI,uint OpNo,SStream *O)

{
  cs_detail *pcVar1;
  uint uVar2;
  MCOperand *op;
  int64_t iVar3;
  uint8_t *puVar4;
  int Value;
  SStream *O_local;
  uint OpNo_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNo);
  iVar3 = MCOperand_getImm(op);
  uVar2 = SignExtend32((uint32_t)iVar3,5);
  if ((int)uVar2 < 0) {
    if ((int)uVar2 < -9) {
      SStream_concat(O,"-0x%x",(ulong)-uVar2);
    }
    else {
      SStream_concat(O,"-%u",(ulong)-uVar2);
    }
  }
  else if ((int)uVar2 < 10) {
    SStream_concat(O,"%u",(ulong)uVar2);
  }
  else {
    SStream_concat(O,"0x%x",(ulong)uVar2);
  }
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar4 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.addr_size * 0x10 + 0x1a;
    puVar4[0] = '\x02';
    puVar4[1] = '\0';
    puVar4[2] = '\0';
    puVar4[3] = '\0';
    *(uint *)(MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.addr_size * 0x10 + 0x1e) = uVar2;
    pcVar1 = MI->flat_insn->detail;
    (pcVar1->field_6).x86.addr_size = (pcVar1->field_6).x86.addr_size + '\x01';
  }
  return;
}

Assistant:

static void printS5ImmOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	int Value = (int)MCOperand_getImm(MCInst_getOperand(MI, OpNo));
	Value = SignExtend32(Value, 5);

	if (Value >= 0) {
		if (Value > HEX_THRESHOLD)
			SStream_concat(O, "0x%x", Value);
		else
			SStream_concat(O, "%u", Value);
	} else {
		if (Value < -HEX_THRESHOLD)
			SStream_concat(O, "-0x%x", -Value);
		else
			SStream_concat(O, "-%u", -Value);
	}

	if (MI->csh->detail) {
		MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].type = PPC_OP_IMM;
		MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].imm = Value;
		MI->flat_insn->detail->ppc.op_count++;
	}
}